

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O3

void __thiscall IRC_Bot::~IRC_Bot(IRC_Bot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR_think_00113ad8;
  if (IRCCommand::selected_server == this) {
    IRCCommand::selected_server = (IRC_Bot *)0x0;
  }
  if (IRCCommand::active_server == this) {
    IRCCommand::active_server = IRCCommand::selected_server;
  }
  pcVar2 = (this->m_commandPrefix)._M_dataplus._M_p;
  paVar1 = &(this->m_commandPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ::~vector(&this->m_commands);
  Jupiter::IRC::Client::~Client(&this->super_Client);
  return;
}

Assistant:

IRC_Bot::~IRC_Bot() {
	if (IRCCommand::selected_server == this) {
		IRCCommand::selected_server = nullptr;
	}

	if (IRCCommand::active_server == this) {
		IRCCommand::active_server = IRCCommand::selected_server;
	}
}